

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvtree.c
# Opt level: O2

int kvtree_unset(kvtree *hash,char *key)

{
  kvtree_elem *in_RAX;
  kvtree_elem *pkVar1;
  
  if ((hash != (kvtree *)0x0) &&
     (pkVar1 = kvtree_elem_extract(hash,key), pkVar1 != (kvtree_elem *)0x0)) {
    kvtree_elem_delete(in_RAX);
  }
  return 0;
}

Assistant:

int kvtree_unset(kvtree* hash, const char* key)
{
  if (hash == NULL) {
    return KVTREE_SUCCESS;
  }

  kvtree_elem* elem = kvtree_elem_extract(hash, key);
  if (elem != NULL) {
    kvtree_elem_delete(elem);
  }
  return KVTREE_SUCCESS;
}